

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

iterator * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
::InnerMap::InsertUniqueInTree
          (iterator *__return_storage_ptr__,InnerMap *this,size_type b,Node *node)

{
  LogMessage *other;
  void **ppvVar1;
  pair<std::_Rb_tree_iterator<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_bool>
  pVar2;
  Node *local_70 [7];
  LogFinisher local_31;
  
  ppvVar1 = this->table_;
  if (ppvVar1[b] != ppvVar1[b ^ 1]) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/map.h"
               ,0x2fe);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_70,"CHECK failed: (table_[b]) == (table_[b ^ 1]): ");
    internal::LogFinisher::operator=(&local_31,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_70);
    ppvVar1 = this->table_;
  }
  node->next = (Node *)0x0;
  local_70[0] = node;
  pVar2 = std::
          _Rb_tree<google::protobuf::internal::KeyView<std::__cxx11::string>*,google::protobuf::internal::KeyView<std::__cxx11::string>*,std::_Identity<google::protobuf::internal::KeyView<std::__cxx11::string>*>,google::protobuf::internal::DerefCompare<google::protobuf::internal::KeyView<std::__cxx11::string>>,google::protobuf::internal::MapAllocator<google::protobuf::internal::KeyView<std::__cxx11::string>*>>
          ::_M_insert_unique<google::protobuf::internal::KeyView<std::__cxx11::string>*>
                    ((_Rb_tree<google::protobuf::internal::KeyView<std::__cxx11::string>*,google::protobuf::internal::KeyView<std::__cxx11::string>*,std::_Identity<google::protobuf::internal::KeyView<std::__cxx11::string>*>,google::protobuf::internal::DerefCompare<google::protobuf::internal::KeyView<std::__cxx11::string>>,google::protobuf::internal::MapAllocator<google::protobuf::internal::KeyView<std::__cxx11::string>*>>
                      *)ppvVar1[b],
                     (KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      **)local_70);
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
  ::iterator_base(__return_storage_ptr__,(_Base_ptr)pVar2.first._M_node,this,b & 0xfffffffffffffffe)
  ;
  return __return_storage_ptr__;
}

Assistant:

iterator InsertUniqueInTree(size_type b, Node* node) {
      GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
      // Maintain the invariant that node->next is null for all Nodes in Trees.
      node->next = nullptr;
      return iterator(
          static_cast<Tree*>(table_[b])->insert(KeyPtrFromNodePtr(node)).first,
          this, b & ~static_cast<size_t>(1));
    }